

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtouchhandler.cpp
# Opt level: O0

void __thiscall QEvdevTouchScreenHandler::~QEvdevTouchScreenHandler(QEvdevTouchScreenHandler *this)

{
  void *pvVar1;
  QEvdevTouchScreenData *in_RDI;
  QEvdevTouchScreenHandler *unaff_retaddr;
  
  in_RDI->q = (QEvdevTouchScreenHandler *)&PTR_metaObject_001849c0;
  if (-1 < *(int *)&(in_RDI->m_touchPoints).d.ptr) {
    qt_safe_close((int)((ulong)in_RDI >> 0x20));
  }
  pvVar1 = (void *)(in_RDI->m_touchPoints).d.size;
  if (pvVar1 != (void *)0x0) {
    QEvdevTouchScreenData::~QEvdevTouchScreenData(in_RDI);
    operator_delete(pvVar1,0x160);
  }
  unregisterPointingDevice(unaff_retaddr);
  QObject::~QObject((QObject *)in_RDI);
  return;
}

Assistant:

QEvdevTouchScreenHandler::~QEvdevTouchScreenHandler()
{
#if QT_CONFIG(mtdev)
    if (m_mtdev) {
        mtdev_close(m_mtdev);
        free(m_mtdev);
    }
#endif

    if (m_fd >= 0)
        QT_CLOSE(m_fd);

    delete d;

    unregisterPointingDevice();
}